

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CoverCrossSyntax::setChild(CoverCrossSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar4;
  logic_error *this_00;
  Token TVar5;
  CoverageIffClauseSyntax *local_160;
  NamedLabelSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  CoverCrossSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar3);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_158 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar3);
    }
    this->label = local_158;
    break;
  case 2:
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar5._0_8_;
    (this->cross).kind = (undefined2)local_28;
    (this->cross).field_0x2 = local_28._2_1_;
    (this->cross).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->cross).rawLen = local_28._4_4_;
    local_20 = TVar5.info;
    (this->cross).info = local_20;
    break;
  case 3:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>>
                       (pSVar3);
    SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::operator=(&this->items,pSVar2);
    break;
  case 4:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_160 = (CoverageIffClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_160 = SyntaxNode::as<slang::syntax::CoverageIffClauseSyntax>(pSVar3);
    }
    this->iff = local_160;
    break;
  case 5:
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar5._0_8_;
    (this->openBrace).kind = (undefined2)local_38;
    (this->openBrace).field_0x2 = local_38._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openBrace).rawLen = local_38._4_4_;
    local_30 = TVar5.info;
    (this->openBrace).info = local_30;
    break;
  case 6:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar3);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(&this->members,pSVar4);
    break;
  case 7:
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar5._0_8_;
    (this->closeBrace).kind = (undefined2)local_48;
    (this->closeBrace).field_0x2 = local_48._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->closeBrace).rawLen = local_48._4_4_;
    local_40 = TVar5.info;
    (this->closeBrace).info = local_40;
    break;
  case 8:
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar5._0_8_;
    (this->emptySemi).kind = (undefined2)local_58;
    (this->emptySemi).field_0x2 = local_58._2_1_;
    (this->emptySemi).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->emptySemi).rawLen = local_58._4_4_;
    local_50 = TVar5.info;
    (this->emptySemi).info = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0xcb1);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void CoverCrossSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 2: cross = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        case 4: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 5: openBrace = child.token(); return;
        case 6: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 7: closeBrace = child.token(); return;
        case 8: emptySemi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}